

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O2

void __thiscall CConnman::Init(CConnman *this,Options *connOptions)

{
  long lVar1;
  pointer pbVar2;
  NetEventsInterface *pNVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer __str;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->nLocalServices = connOptions->nLocalServices;
  iVar5 = connOptions->m_max_automatic_connections;
  this->m_max_automatic_connections = iVar5;
  iVar7 = 8;
  if (iVar5 < 8) {
    iVar7 = iVar5;
  }
  this->m_max_outbound_full_relay = iVar7;
  iVar6 = 2;
  if (iVar5 - iVar7 < 2) {
    iVar6 = iVar5 - iVar7;
  }
  this->m_max_outbound_block_relay = iVar6;
  iVar7 = iVar6 + iVar7 + this->m_max_feeler;
  iVar5 = iVar5 - iVar7;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  this->m_max_automatic_outbound = iVar7;
  this->m_max_inbound = iVar5;
  this->m_use_addrman_outgoing = connOptions->m_use_addrman_outgoing;
  this->m_banman = connOptions->m_banman;
  pNVar3 = connOptions->m_msgproc;
  this->m_client_interface = connOptions->uiInterface;
  this->m_msgproc = pNVar3;
  uVar4 = connOptions->nReceiveFloodSize;
  this->nSendBufferMaxSize = connOptions->nSendBufferMaxSize;
  this->nReceiveFloodSize = uVar4;
  (this->m_peer_connect_timeout).__r = connOptions->m_peer_connect_timeout;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock6,&this->m_total_bytes_sent_mutex,"m_total_bytes_sent_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.h",0x43a,
             false);
  this->nMaxOutboundLimit = connOptions->nMaxOutboundLimit;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&criticalblock6);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::operator=
            (&this->vWhitelistedRangeIncoming,&connOptions->vWhitelistedRangeIncoming);
  std::vector<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>::operator=
            (&this->vWhitelistedRangeOutgoing,&connOptions->vWhitelistedRangeOutgoing);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock7,&this->m_added_nodes_mutex,"m_added_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.h",0x440,
             false);
  pbVar2 = (connOptions->m_added_nodes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__str = (connOptions->m_added_nodes).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __str != pbVar2; __str = __str + 1) {
    std::__cxx11::string::string((string *)&criticalblock6,__str);
    std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::emplace_back<AddedNodeParams>
              (&this->m_added_node_params,(AddedNodeParams *)&criticalblock6);
    std::__cxx11::string::~string((string *)&criticalblock6);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  std::vector<CService,_std::allocator<CService>_>::operator=
            (&this->m_onion_binds,&connOptions->onion_binds);
  this->whitelist_forcerelay = connOptions->whitelist_forcerelay;
  this->whitelist_relay = connOptions->whitelist_relay;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_added_nodes_mutex, !m_total_bytes_sent_mutex)
    {
        AssertLockNotHeld(m_total_bytes_sent_mutex);

        nLocalServices = connOptions.nLocalServices;
        m_max_automatic_connections = connOptions.m_max_automatic_connections;
        m_max_outbound_full_relay = std::min(MAX_OUTBOUND_FULL_RELAY_CONNECTIONS, m_max_automatic_connections);
        m_max_outbound_block_relay = std::min(MAX_BLOCK_RELAY_ONLY_CONNECTIONS, m_max_automatic_connections - m_max_outbound_full_relay);
        m_max_automatic_outbound = m_max_outbound_full_relay + m_max_outbound_block_relay + m_max_feeler;
        m_max_inbound = std::max(0, m_max_automatic_connections - m_max_automatic_outbound);
        m_use_addrman_outgoing = connOptions.m_use_addrman_outgoing;
        m_client_interface = connOptions.uiInterface;
        m_banman = connOptions.m_banman;
        m_msgproc = connOptions.m_msgproc;
        nSendBufferMaxSize = connOptions.nSendBufferMaxSize;
        nReceiveFloodSize = connOptions.nReceiveFloodSize;
        m_peer_connect_timeout = std::chrono::seconds{connOptions.m_peer_connect_timeout};
        {
            LOCK(m_total_bytes_sent_mutex);
            nMaxOutboundLimit = connOptions.nMaxOutboundLimit;
        }
        vWhitelistedRangeIncoming = connOptions.vWhitelistedRangeIncoming;
        vWhitelistedRangeOutgoing = connOptions.vWhitelistedRangeOutgoing;
        {
            LOCK(m_added_nodes_mutex);
            // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
            // peer doesn't support it or immediately disconnects us for another reason.
            const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
            for (const std::string& added_node : connOptions.m_added_nodes) {
                m_added_node_params.push_back({added_node, use_v2transport});
            }
        }
        m_onion_binds = connOptions.onion_binds;
        whitelist_forcerelay = connOptions.whitelist_forcerelay;
        whitelist_relay = connOptions.whitelist_relay;
    }